

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_PlayerHandTest_Kon_TestShell::createTest(TEST_PlayerHandTest_Kon_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x60,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
                                  ,0x25);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  this_00[4]._vptr_Utest = (_func_int **)0x0;
  this_00[5]._vptr_Utest = (_func_int **)0x0;
  this_00[6]._vptr_Utest = (_func_int **)0x0;
  this_00[7]._vptr_Utest = (_func_int **)0x0;
  this_00[8]._vptr_Utest = (_func_int **)0x0;
  this_00[9]._vptr_Utest = (_func_int **)0x0;
  this_00[10]._vptr_Utest = (_func_int **)0x0;
  this_00[0xb]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  *(undefined4 *)&this_00[3]._vptr_Utest = 0;
  this_00[4]._vptr_Utest = (_func_int **)0x0;
  this_00[5]._vptr_Utest = (_func_int **)(this_00 + 3);
  this_00[6]._vptr_Utest = (_func_int **)(this_00 + 3);
  this_00[7]._vptr_Utest = (_func_int **)0x0;
  this_00[8]._vptr_Utest = (_func_int **)0x0;
  this_00[9]._vptr_Utest = (_func_int **)0x0;
  this_00[10]._vptr_Utest = (_func_int **)0x0;
  *(undefined4 *)&this_00[0xb]._vptr_Utest = 0;
  this_00->_vptr_Utest = (_func_int **)&PTR__TEST_GROUP_CppUTestGroupPlayerHandTest_001dcc10;
  return this_00;
}

Assistant:

TEST(PlayerHandTest, Kon)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindOpenQuad({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}